

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O1

int __thiscall jrtplib::RTPPacketBuilder::Init(RTPPacketBuilder *this,size_t max)

{
  RTPMemoryManager *pRVar1;
  uint32_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  
  iVar5 = -0xc;
  if (this->init == false) {
    if (max == 0) {
      iVar5 = -0x13;
    }
    else {
      this->maxpacksize = max;
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        puVar4 = (uint8_t *)operator_new__(max);
      }
      else {
        puVar4 = (uint8_t *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,max,9);
      }
      this->buffer = puVar4;
      if (puVar4 == (uint8_t *)0x0) {
        iVar5 = -1;
      }
      else {
        iVar5 = 0;
        this->packetlength = 0;
        uVar2 = (*this->rtprnd->_vptr_RTPRandom[4])();
        this->ssrc = uVar2;
        uVar2 = (*this->rtprnd->_vptr_RTPRandom[4])();
        this->timestamp = uVar2;
        iVar3 = (*this->rtprnd->_vptr_RTPRandom[3])();
        this->seqnr = (uint16_t)iVar3;
        this->numpayloadbytes = 0;
        this->numpackets = 0;
        this->deftsset = false;
        this->defptset = false;
        this->defmarkset = false;
        this->numcsrcs = 0;
        this->init = true;
      }
    }
  }
  return iVar5;
}

Assistant:

int RTPPacketBuilder::Init(size_t max)
{
	if (init)
		return ERR_RTP_PACKBUILD_ALREADYINIT;
	if (max <= 0)
		return ERR_RTP_PACKBUILD_INVALIDMAXPACKETSIZE;
	
	maxpacksize = max;
	buffer = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKETBUILDERBUFFER) uint8_t [max];
	if (buffer == 0)
		return ERR_RTP_OUTOFMEM;
	packetlength = 0;
	
	CreateNewSSRC();

	deftsset = false;
	defptset = false;
	defmarkset = false;
		
	numcsrcs = 0;
	
	init = true;
	return 0;
}